

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

int DataVector::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  long lVar2;
  iterator __position;
  undefined8 uVar3;
  double dVar4;
  undefined7 uVar5;
  const_reference cVar6;
  undefined1 *puVar7;
  undefined7 extraout_var;
  undefined1 *extraout_RAX;
  undefined8 *in_RCX;
  vector<DataPoint,std::allocator<DataPoint>> *in_RDX;
  DataPoint *__args;
  long lVar8;
  undefined1 *puVar9;
  vector<bool,_std::allocator<bool>_> *in_R8;
  undefined8 *in_R9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  
  puVar10 = *(undefined1 **)(in_RDX + 8);
  for (puVar7 = *(undefined1 **)in_RDX; puVar7 != puVar10; puVar7 = puVar7 + 0x10) {
    *puVar7 = 0;
  }
  if (*(long *)src != 0) {
    lVar8 = 0;
    puVar10 = (undefined1 *)0x0;
    puVar11 = (undefined1 *)0x0;
    do {
      if (puVar10 < (undefined1 *)*in_R9) {
        cVar6 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,(size_type)puVar10);
        puVar7 = (undefined1 *)CONCAT71(extraout_var,cVar6);
        if (cVar6) goto LAB_001862d1;
      }
      else {
LAB_001862d1:
        lVar1 = *(long *)dst;
        puVar9 = puVar10;
        if (puVar11 < (undefined1 *)*in_RCX) {
          puVar7 = (undefined1 *)(*(long *)(dst + 8) - lVar1 >> 4);
          if (puVar7 <= puVar10) {
LAB_00186383:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       puVar9,puVar7);
          }
          lVar2 = *(long *)in_RDX;
          puVar7 = (undefined1 *)(*(long *)(in_RDX + 8) - lVar2 >> 4);
          puVar9 = puVar11;
          if (puVar7 <= puVar11) goto LAB_00186383;
          puVar7 = (undefined1 *)((long)puVar11 * 0x10);
          uVar3 = ((undefined8 *)(lVar1 + lVar8))[1];
          *(undefined8 *)(puVar7 + lVar2) = *(undefined8 *)(lVar1 + lVar8);
          *(undefined8 *)((long)(puVar7 + lVar2) + 8) = uVar3;
        }
        else {
          puVar7 = (undefined1 *)(*(long *)(dst + 8) - lVar1 >> 4);
          if (puVar7 <= puVar10) goto LAB_00186383;
          __args = (DataPoint *)(lVar1 + lVar8);
          __position._M_current = *(DataPoint **)(in_RDX + 8);
          if (__position._M_current == *(DataPoint **)(in_RDX + 0x10)) {
            std::vector<DataPoint,std::allocator<DataPoint>>::_M_realloc_insert<DataPoint_const&>
                      (in_RDX,__position,__args);
            puVar7 = extraout_RAX;
          }
          else {
            uVar5 = *(undefined7 *)&__args->field_0x1;
            dVar4 = __args->value;
            (__position._M_current)->active = __args->active;
            *(undefined7 *)&(__position._M_current)->field_0x1 = uVar5;
            (__position._M_current)->value = dVar4;
            *(long *)(in_RDX + 8) = *(long *)(in_RDX + 8) + 0x10;
          }
        }
        puVar11 = puVar11 + 1;
      }
      puVar10 = puVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (puVar10 < *(undefined1 **)src);
  }
  return (int)puVar7;
}

Assistant:

static
    void copy(DataVector const & src,
              DataVector::size_type const & numSrc,
              DataVector & dst,
              DataVector::size_type const & numDst,
              std::vector<bool> const & mask,
              DataVector::size_type const & numMask)
    {

        // Deactivate all destination value by default
        dst.deactivate();

        // Copy elements
        DataVector::size_type j = 0;
        for (DataVector::size_type i = 0; i < numSrc; i++)
        {
            // Check if current value is masked out
            if (i < numMask)
            {
                if (!mask.at(i)) continue;
            }

            // Add or set next value
            if (j >= numDst)
            {
                dst.push_back(src.at(i));
            }
            else
            {
                dst.at(j) = src.at(i);
            }
            j++;
        }

    }